

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Lexer::ParseEllipse(Lexer *this)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  bool bVar6;
  
  pcVar4 = this->m_current;
  cVar2 = *pcVar4;
  if ((cVar2 != '\0') && (pcVar4 <= this->m_end)) {
    uVar5 = 0;
    do {
      if (cVar2 != '.') {
        Error<>(this,"Expected ellipse");
        return;
      }
      sVar3 = GetUtf8CharSize(pcVar4);
      pcVar1 = this->m_current;
      pcVar4 = pcVar1 + sVar3;
      this->m_current = pcVar4;
      this->m_columnNumber = this->m_columnNumber + 1;
      cVar2 = pcVar1[sVar3];
    } while (((cVar2 != '\0') && (pcVar4 <= this->m_end)) &&
            (bVar6 = uVar5 < 2, uVar5 = uVar5 + 1, bVar6));
  }
  ParseWhitespaceAndNewlines(this);
  pcVar4 = this->m_current;
  cVar2 = *pcVar4;
  if (cVar2 == '\r') {
    sVar3 = GetUtf8CharSize(pcVar4);
    pcVar1 = this->m_current;
    pcVar4 = pcVar1 + sVar3;
    this->m_current = pcVar4;
    this->m_columnNumber = this->m_columnNumber + 1;
    cVar2 = pcVar1[sVar3];
  }
  if ((cVar2 == '\n') && (pcVar4 <= this->m_end)) {
    sVar3 = GetUtf8CharSize(pcVar4);
    this->m_current = this->m_current + sVar3;
    this->m_columnNumber = this->m_columnNumber + 1;
  }
  return;
}

Assistant:

inline_t void Lexer::ParseEllipse()
	{
		int count = 0;
		while (!IsEndOfText() && count < 3)
		{
			char c = *m_current;
			if (c != '.')
			{
				Error("Expected ellipse");
				return;
			}
			++count;
			AdvanceCurrent();
		}
		ParseWhitespaceAndNewlines();
		if (*m_current == '\r')
			AdvanceCurrent();
		if (IsEndOfText())
			return;
		if (*m_current == '\n')
			AdvanceCurrent();
	}